

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int memory_access_size(MemoryRegion_conflict *mr,uint l,hwaddr addr)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = (mr->ops->valid).max_access_size;
  uVar2 = 4;
  if (uVar5 != 0) {
    uVar2 = uVar5;
  }
  if ((mr->ops->impl).unaligned == false) {
    uVar4 = -(uint)addr & (uint)addr;
    uVar5 = uVar4;
    if (uVar2 < uVar4) {
      uVar5 = uVar2;
    }
    if (uVar4 != 0) {
      uVar2 = uVar5;
    }
  }
  uVar6 = (ulong)l;
  if (uVar2 < l) {
    uVar6 = (ulong)uVar2;
  }
  lVar1 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar3 = (int)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
  if ((int)uVar6 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int memory_access_size(MemoryRegion *mr, unsigned l, hwaddr addr)
{
    unsigned access_size_max = mr->ops->valid.max_access_size;

    /* Regions are assumed to support 1-4 byte accesses unless
       otherwise specified.  */
    if (access_size_max == 0) {
        access_size_max = 4;
    }

    /* Bound the maximum access by the alignment of the address.  */
    if (!mr->ops->impl.unaligned) {
#ifdef _MSC_VER
        unsigned align_size_max = addr & (0ULL - addr);
#else
        unsigned align_size_max = addr & -addr;
#endif
        if (align_size_max != 0 && align_size_max < access_size_max) {
            access_size_max = align_size_max;
        }
    }

    /* Don't attempt accesses larger than the maximum.  */
    if (l > access_size_max) {
        l = access_size_max;
    }
    l = pow2floor(l);

    return l;
}